

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_object_detail.hpp
# Opt level: O0

bool __thiscall
chaiscript::dispatch::detail::Dynamic_Object_Function::call_match
          (Dynamic_Object_Function *this,Function_Params *vals,Type_Conversions_State *t_conversions
          )

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  Type_Conversions_State *t_conversions_local;
  Function_Params *vals_local;
  Dynamic_Object_Function *this_local;
  
  bVar1 = dynamic_object_typename_match(this,vals,&this->m_type_name,&this->m_ti,t_conversions);
  if (bVar1) {
    peVar3 = std::
             __shared_ptr_access<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->m_func);
    iVar2 = (*peVar3->_vptr_Proxy_Function_Base[3])(peVar3,vals,t_conversions);
    this_local._7_1_ = (bool)((byte)iVar2 & 1);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool call_match(const chaiscript::Function_Params &vals, const Type_Conversions_State &t_conversions) const noexcept override {
          if (dynamic_object_typename_match(vals, m_type_name, m_ti, t_conversions)) {
            return m_func->call_match(vals, t_conversions);
          } else {
            return false;
          }
        }